

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_column.h
# Opt level: O0

bool Gudhi::persistence_matrix::operator<
               (Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>
                *c1,Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>
                    *c2)

{
  bool bVar1;
  ID_index IVar2;
  ID_index IVar3;
  reference ppEVar4;
  bool local_49;
  _Self local_48;
  _Self local_40;
  _Self local_38;
  _Self local_30;
  iterator it2;
  iterator it1;
  Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>
  *c2_local;
  Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>
  *c1_local;
  
  if (c1 == c2) {
    c1_local._7_1_ = false;
  }
  else {
    it2 = std::
          set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>_*,_Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>::EntryPointerComp,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>_*>_>
          ::begin(&c1->column_);
    local_30._M_node =
         (_Base_ptr)
         std::
         set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>_*,_Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>::EntryPointerComp,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>_*>_>
         ::begin(&c2->column_);
    while( true ) {
      local_38._M_node =
           (_Base_ptr)
           std::
           set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>_*,_Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>::EntryPointerComp,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>_*>_>
           ::end(&c1->column_);
      bVar1 = std::operator!=(&it2,&local_38);
      local_49 = false;
      if (bVar1) {
        local_40._M_node =
             (_Base_ptr)
             std::
             set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>_*,_Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>::EntryPointerComp,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>_*>_>
             ::end(&c2->column_);
        local_49 = std::operator!=(&local_30,&local_40);
      }
      if (local_49 == false) {
        local_48._M_node =
             (_Base_ptr)
             std::
             set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>_*,_Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>::EntryPointerComp,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>_*>_>
             ::end(&c2->column_);
        bVar1 = std::operator!=(&local_30,&local_48);
        return bVar1;
      }
      ppEVar4 = std::
                _Rb_tree_const_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>_*>
                ::operator*(&it2);
      IVar2 = Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>
              ::get_row_index(*ppEVar4);
      ppEVar4 = std::
                _Rb_tree_const_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>_*>
                ::operator*(&local_30);
      IVar3 = Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>
              ::get_row_index(*ppEVar4);
      if (IVar2 != IVar3) break;
      std::
      _Rb_tree_const_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>_*>
      ::operator++(&it2);
      std::
      _Rb_tree_const_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>_*>
      ::operator++(&local_30);
    }
    ppEVar4 = std::
              _Rb_tree_const_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>_*>
              ::operator*(&it2);
    IVar2 = Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>
            ::get_row_index(*ppEVar4);
    ppEVar4 = std::
              _Rb_tree_const_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>_*>
              ::operator*(&local_30);
    IVar3 = Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>
            ::get_row_index(*ppEVar4);
    c1_local._7_1_ = IVar2 < IVar3;
  }
  return c1_local._7_1_;
}

Assistant:

bool operator<(const Set_column& c1, const Set_column& c2) {
    if (&c1 == &c2) return false;

    auto it1 = c1.column_.begin();
    auto it2 = c2.column_.begin();
    while (it1 != c1.column_.end() && it2 != c2.column_.end()) {
      if ((*it1)->get_row_index() != (*it2)->get_row_index()) return (*it1)->get_row_index() < (*it2)->get_row_index();
      if constexpr (!Master_matrix::Option_list::is_z2) {
        if ((*it1)->get_element() != (*it2)->get_element()) return (*it1)->get_element() < (*it2)->get_element();
      }
      ++it1;
      ++it2;
    }
    return it2 != c2.column_.end();
  }